

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O1

string * __thiscall phosg::MD5::bin_abi_cxx11_(string *__return_storage_ptr__,MD5 *this)

{
  StringWriter w;
  uint32_t local_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_3c = this->a0;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_38,(char *)&local_3c,4);
  local_3c = this->b0;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_38,(char *)&local_3c,4);
  local_3c = this->c0;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_38,(char *)&local_3c,4);
  local_3c = this->d0;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_38,(char *)&local_3c,4);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == &local_38.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_38._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

string MD5::bin() const {
  StringWriter w;
  w.put_u32l(a0);
  w.put_u32l(b0);
  w.put_u32l(c0);
  w.put_u32l(d0);
  return std::move(w.str());
}